

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestDynamicExtensions_DynamicMessageType::~TestDynamicExtensions_DynamicMessageType
          (TestDynamicExtensions_DynamicMessageType *this)

{
  ~TestDynamicExtensions_DynamicMessageType(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

inline void TestDynamicExtensions_DynamicMessageType::SharedDtor(MessageLite& self) {
  TestDynamicExtensions_DynamicMessageType& this_ = static_cast<TestDynamicExtensions_DynamicMessageType&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}